

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void model_estimate(double *x,int N,int d,int pmax,int h)

{
  uint uVar1;
  int iVar2;
  double *oup;
  double *phi;
  long lVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  int N_00;
  long lVar5;
  ulong uVar6;
  int pq;
  long lVar7;
  uint q;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double local_c8;
  double sos;
  double var;
  double local_b0;
  double local_a8;
  double local_a0;
  double *local_98;
  undefined8 local_90;
  double *local_88;
  uint local_7c;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double *local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  
  local_90 = CONCAT44(in_register_0000000c,pmax);
  oup = (double *)malloc((long)(N - d) << 3);
  local_34 = N;
  if (0 < d) {
    local_34 = diff(x,N,d,oup);
  }
  lVar7 = (long)h;
  phi = (double *)malloc(lVar7 * 8);
  iVar2 = local_34;
  lVar4 = (long)local_34;
  local_70 = (double)(lVar4 * 8);
  local_50 = h;
  local_58 = (double *)malloc((size_t)local_70);
  dVar11 = mean(x,iVar2);
  uVar8 = local_50;
  local_88 = phi;
  if (iVar2 < 1) {
    ywalg(oup,local_34,local_50,phi);
    uVar8 = local_50;
  }
  else {
    lVar3 = 0;
    do {
      oup[lVar3] = x[lVar3] - dVar11;
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
    ywalg(oup,local_34,local_50,phi);
    if (0 < local_34) {
      memset(local_58,0,(size_t)local_70);
    }
  }
  if ((int)uVar8 < local_34) {
    lVar3 = (lVar7 << 0x20) + -0x100000000;
    do {
      dVar11 = oup[lVar7];
      local_58[lVar7] = dVar11;
      if (0 < (int)uVar8) {
        uVar6 = 0;
        lVar5 = lVar3;
        do {
          dVar11 = dVar11 - phi[uVar6] * *(double *)((long)oup + (lVar5 >> 0x1d));
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + -0x100000000;
        } while (uVar8 != uVar6);
        local_58[lVar7] = dVar11;
      }
      lVar7 = lVar7 + 1;
      lVar3 = lVar3 + 0x100000000;
    } while (lVar7 != lVar4);
  }
  iVar2 = (int)local_90;
  local_98 = oup;
  if (iVar2 < 0) {
    local_38 = 0;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    local_4c = 0;
    local_48 = 0;
  }
  else {
    local_70 = (double)local_34;
    dVar11 = 0.0;
    local_78 = 0.0;
    uVar9 = 0;
    local_48 = 0;
    local_4c = 0;
    local_44 = 0;
    local_40 = 0;
    local_3c = 0;
    local_38 = 0;
    dVar12 = 0.0;
    N_00 = local_34;
    uVar8 = 0;
    do {
      uVar6 = 0;
      local_7c = uVar9;
      do {
        q = (uint)uVar6;
        pq = uVar8 + q;
        if (pq != 0) {
          var = dVar11;
          local_b0 = dVar12;
          hrstep2(local_98,N_00,local_50,uVar8,q,pq,local_58,&local_c8,&sos);
          local_60 = log(sos);
          local_68 = (double)pq;
          local_a8 = (double)uVar9 / local_70 + local_60;
          dVar11 = log(local_70);
          local_a0 = (dVar11 * local_68) / local_70 + local_60;
          dVar11 = log(local_70);
          dVar11 = log(dVar11);
          dVar11 = ((dVar11 + dVar11) * local_68) / local_70 + local_60;
          if (q == 1 && uVar8 == 0) {
            local_3c = 1;
            local_38 = 0;
            local_68 = local_a8;
            local_60 = local_a0;
            local_40 = 0;
            local_44 = 1;
            local_4c = 0;
            local_48 = 1;
            local_78 = dVar11;
          }
          else {
            if (local_a8 < local_b0) {
              local_3c = q;
              local_38 = uVar8;
            }
            if (local_a0 < var) {
              local_40 = uVar8;
            }
            local_68 = local_a8;
            if (local_b0 <= local_a8) {
              local_68 = local_b0;
            }
            local_60 = local_a0;
            uVar1 = q;
            if (var <= local_a0) {
              local_60 = var;
              uVar1 = local_44;
            }
            local_44 = uVar1;
            if (dVar11 < local_78) {
              local_78 = dVar11;
              local_4c = uVar8;
              local_48 = q;
            }
          }
          printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n",local_a8,local_a0,(ulong)uVar8,uVar6
                );
          dVar11 = local_60;
          dVar12 = local_68;
          N_00 = local_34;
        }
        uVar6 = (ulong)(q + 1);
        uVar9 = uVar9 + 2;
      } while (iVar2 + 1U != q + 1);
      uVar9 = local_7c + 2;
      bVar10 = uVar8 != (uint)local_90;
      uVar8 = uVar8 + 1;
    } while (bVar10);
  }
  puts("\n");
  printf("AIC Estimate : p = %d q = %d \n",(ulong)local_38,(ulong)local_3c);
  printf("SC Estimate  : p = %d q = %d \n",(ulong)local_40,(ulong)local_44);
  printf("HQ Estimate  : p = %d q = %d \n",(ulong)local_4c,(ulong)local_48);
  free(local_98);
  free(local_88);
  free(local_58);
  return;
}

Assistant:

void model_estimate(double *x, int N, int d, int pmax, int h) {
	int m, i, t, pq, j;
	double wmean, sos, var, lvar, aic, sc, hq, aic0, sc0, hq0;
	double *inp, *phim, *a;
	int paic, qaic, psc, qsc, phq, qhq;
	/*
	x - Input Time Series of length N
	d - Number of time the series has to be differenced (d = 0 when there are no trends)
	pmax - Maximum AR and MA order pmax = max(p,q)
	h - Order of AR model to be fitted to obtain residuals
	0 <= pmax <= h
	Typically pmax = 3,4 and h = 8. Increase value of h if you want to fit high order ARMA process
	*/

	inp = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(x, N, d, inp); // No need to demean x
	}

	m = h;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}
	aic0 = sc0 = hq0 = 0.0;
	paic = qaic = psc = qsc = phq = qhq = 0;

	for (i = 0; i <= pmax; ++i) {
		for (j = 0; j <= pmax; ++j) {
			pq = i + j;
			if (pq >= 1) {
				hrstep2(inp, N, m, i, j, pq, a, &sos, &var);
				lvar = log(var);
				aic = lvar + 2 * (double)pq / N;
				sc = lvar + log((double)N) * (double)pq / N;
				hq = lvar + 2 * log(log((double)N)) * (double)pq / N;
				if (i == 0 && j == 1) {
					aic0 = aic;
					sc0 = sc;
					hq0 = hq;
					paic = psc = phq = 0;
					qaic = qsc = qhq = 1;
				}
				else {
					if (aic < aic0) {
						aic0 = aic;
						paic = i;
						qaic = j;
					}
					if (sc < sc0) {
						sc0 = sc;
						psc = i;
						qsc = j;
					}
					if (hq < hq0) {
						hq0 = hq;
						phq = i;
						qhq = j;
					}
				}
				printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n", i, j, aic, sc, hq);
			}
		}
	}

	printf("\n\n");
	printf("AIC Estimate : p = %d q = %d \n", paic, qaic);
	printf("SC Estimate  : p = %d q = %d \n", psc, qsc);
	printf("HQ Estimate  : p = %d q = %d \n", phq, qhq);

	free(inp);
	free(phim);
	free(a);
}